

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  NodeList *__x;
  NodeList adjList;
  TraverseMinimizer sb;
  ofstream outfile;
  ifstream input;
  vector<Node_*,_std::allocator<Node_*>_> local_458;
  TraverseMinimizer local_440;
  InputParser local_420;
  filebuf local_418 [240];
  ios_base local_328 [264];
  ifstream local_220 [520];
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Syntax: ./project3 <input_file> <output_file> [verbose]",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "(add any character to the end to output results to the console)",0x3f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    iVar1 = 1;
  }
  else {
    std::ifstream::ifstream(local_220,argv[1],_S_in);
    InputParser::InputParser(&local_420,local_220);
    __x = InputParser::parse(&local_420);
    std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_458,__x);
    TraverseMinimizer::TraverseMinimizer(&local_440,&local_458);
    if (3 < argc) {
      report((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_440.startingPoints);
    }
    std::ofstream::ofstream(&local_420,argv[2],_S_out);
    report((basic_ostream<char,_std::char_traits<char>_> *)&local_420,&local_440.startingPoints);
    local_420.input = _VTT;
    *(undefined8 *)(local_418 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
    std::filebuf::~filebuf(local_418);
    std::ios_base::~ios_base(local_328);
    if (local_440.startingPoints.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_440.startingPoints.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_458.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_458.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::ifstream::~ifstream(local_220);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    bool verbose = argc > 3;
    if (argc < 3) {
        std::cout << "Syntax: ./project3 <input_file> <output_file> [verbose]" << std::endl;
        std::cout << "(add any character to the end to output results to the console)" << std::endl;
        return 1;
    }

    std::ifstream input(argv[1]);
    NodeList adjList = InputParser(input).parse();
    TraverseMinimizer sb(adjList);

    if (verbose) {
        report(std::cout, sb.startingPoints);
    }

    std::ofstream outfile(argv[2]);
    report(outfile, sb.startingPoints);
}